

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

void mctools_impl_error(char *msg)

{
  undefined8 in_RDI;
  
  fprintf(_stderr,"%s\n",in_RDI);
  exit(1);
}

Assistant:

void mctools_impl_error( const char * msg )
    {
#ifdef __cplusplus
      throw std::runtime_error(msg);
#else
      fprintf(stderr, "%s\n",msg);
      exit(EXIT_FAILURE);
#endif
    }